

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelConnects::~IfcRelConnects(IfcRelConnects *this,void **vtt)

{
  void **vtt_local;
  IfcRelConnects *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelConnects,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelConnects,_0UL> *)
             &(this->super_IfcRelationship).super_IfcRoot.field_0x98,vtt + 10);
  IfcRelationship::~IfcRelationship(&this->super_IfcRelationship,vtt + 1);
  return;
}

Assistant:

IfcRelConnects() : Object("IfcRelConnects") {}